

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_binbuf.c
# Opt level: O1

void binbuf_eval(_binbuf *x,t_pd *target,int argc,t_atom *argv)

{
  uint uVar1;
  t_gpointer *gp;
  bool bVar2;
  int iVar3;
  long lVar4;
  t_symbol *ptVar5;
  t_atom *a;
  word *pwVar6;
  char *pcVar7;
  _class **x_00;
  t_atom *ptVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  t_atom *ptVar12;
  t_atomtype tVar13;
  undefined4 uVar14;
  t_float tVar15;
  undefined4 uVar16;
  undefined1 local_d8 [8];
  t_atom smallstack [5];
  _class **local_70;
  t_atom *local_48;
  uint local_3c;
  
  a = x->b_vec;
  uVar9 = x->b_n;
  uVar11 = (ulong)uVar9;
  local_48 = (t_atom *)local_d8;
  local_3c = 0;
  pwVar6 = (word *)local_d8;
  if (5 < (int)uVar9) {
    local_3c = uVar9;
    if (target != &pd_objectmaker) {
      lVar4 = 0;
      uVar9 = -(uint)(target == (t_pd *)0x0);
      local_3c = 0;
      do {
        iVar10 = *(int *)((long)&a->a_type + lVar4);
        if (iVar10 == 4) {
          uVar9 = 0xffffffff;
        }
        else if (iVar10 == 5) {
          uVar9 = 0;
        }
        else {
          uVar1 = uVar9 + 1;
          bVar2 = (int)local_3c <= (int)uVar9;
          uVar9 = uVar1;
          if (bVar2) {
            local_3c = uVar1;
          }
        }
        lVar4 = lVar4 + 0x10;
      } while (uVar11 << 4 != lVar4);
    }
    pwVar6 = (word *)local_d8;
    if (5 < (int)local_3c) {
      if ((int)local_3c < 1000) {
        local_48 = (t_atom *)&smallstack[-1 - (ulong)local_3c].a_w;
        pwVar6 = (word *)local_48;
      }
      else {
        local_48 = (t_atom *)getbytes((ulong)local_3c * 0x10);
        pwVar6 = (word *)local_d8;
      }
    }
  }
  x_00 = target;
  ptVar8 = local_48;
LAB_001699b6:
  iVar10 = (int)uVar11;
  if (x_00 == (_class **)0x0) {
    bVar2 = true;
    uVar11 = 0;
    if (iVar10 != 0) {
      uVar9 = -iVar10;
      ptVar12 = a;
      do {
        ptVar12 = ptVar12 + 1;
        tVar13 = a->a_type;
        if ((tVar13 & ~A_FLOAT) != A_SEMI) {
          if (tVar13 == A_DOLLSYM) {
            ptVar5 = (a->a_w).w_symbol;
            *(undefined8 *)(pwVar6 + -1) = 0x169a3b;
            ptVar5 = binbuf_realizedollsym(ptVar5,argc,argv,0);
            if (ptVar5 != (t_symbol *)0x0) goto LAB_00169a85;
            pcVar7 = ((a->a_w).w_symbol)->s_name;
            *(undefined8 *)(pwVar6 + -1) = 0x169a5c;
            pd_error(target,"$%s: not enough arguments supplied",pcVar7);
          }
          else if (tVar13 == A_DOLLAR) {
            uVar1 = (a->a_w).w_index;
            if ((int)uVar1 < 1 || argc < (int)uVar1) {
              pcVar7 = "$%d: not enough arguments supplied";
            }
            else {
              if (argv[(ulong)uVar1 - 1].a_type == A_SYMBOL) {
                ptVar5 = argv[(ulong)uVar1 - 1].a_w.w_symbol;
                goto LAB_00169a85;
              }
              pcVar7 = "$%d: symbol needed as message destination";
            }
            *(undefined8 *)(pwVar6 + -1) = 0x169aca;
            pd_error(target,pcVar7);
          }
          else {
            *(undefined8 *)(pwVar6 + -1) = 0x169a6a;
            ptVar5 = atom_getsymbol(a);
LAB_00169a85:
            x_00 = ptVar5->s_thing;
            if (x_00 != (_class **)0x0) {
              a = a + 1;
              uVar11 = (ulong)~uVar9;
              break;
            }
            pcVar7 = ptVar5->s_name;
            *(undefined8 *)(pwVar6 + -1) = 0x169ab2;
            pd_error(target,"%s: no such object ",pcVar7);
            x_00 = (_class **)0x0;
          }
          uVar11 = (ulong)-uVar9;
          goto LAB_00169ad7;
        }
        a = a + 1;
        uVar9 = uVar9 + 1;
      } while (uVar9 != 0);
    }
    goto LAB_00169af4;
  }
  goto LAB_00169b05;
  while( true ) {
    uVar11 = (ulong)((int)uVar11 - 1);
    ptVar12 = a + 1;
    if (a->a_type == A_SEMI) break;
LAB_00169ad7:
    a = ptVar12;
    if ((int)uVar11 == 1) {
      uVar11 = 0;
      break;
    }
  }
  bVar2 = false;
LAB_00169af4:
  if (!bVar2) goto LAB_001699b6;
LAB_00169b05:
  if ((int)uVar11 == 0) {
    uVar11 = 0;
    bVar2 = false;
    goto LAB_00169dc5;
  }
  iVar10 = 0;
  local_70 = x_00;
  do {
    iVar3 = 0x10;
    if ((int)uVar11 == 0) {
      uVar11 = 0;
LAB_00169b59:
      bVar2 = false;
    }
    else {
      switch(a->a_type) {
      case A_FLOAT:
      case A_SYMBOL:
        tVar13 = a->a_type;
        uVar14 = *(undefined4 *)&a->field_0x4;
        tVar15 = (a->a_w).w_float;
        uVar16 = *(undefined4 *)((long)&a->a_w + 4);
LAB_00169b4e:
        ptVar8->a_type = tVar13;
        *(undefined4 *)&ptVar8->field_0x4 = uVar14;
        (ptVar8->a_w).w_float = tVar15;
        *(undefined4 *)((long)&ptVar8->a_w + 4) = uVar16;
        break;
      default:
        bVar2 = false;
        *(undefined8 *)(pwVar6 + -1) = 0x169bc3;
        bug("bad item in binbuf");
        iVar3 = 0x12;
        goto LAB_00169cf5;
      case A_SEMI:
        if (x_00 != &pd_objectmaker) {
          local_70 = (_class **)0x0;
          goto LAB_00169b59;
        }
        ptVar8->a_type = A_SYMBOL;
        pcVar7 = ";";
LAB_00169c6b:
        *(undefined8 *)(pwVar6 + -1) = 0x169c70;
        ptVar5 = gensym(pcVar7);
        (ptVar8->a_w).w_symbol = ptVar5;
        break;
      case A_COMMA:
        if (x_00 == &pd_objectmaker) {
          ptVar8->a_type = A_SYMBOL;
          pcVar7 = ",";
          goto LAB_00169c6b;
        }
        goto LAB_00169b59;
      case A_DOLLAR:
        uVar9 = (a->a_w).w_index;
        if ((int)uVar9 <= argc && 0 < (int)uVar9) {
          ptVar12 = argv + ((ulong)uVar9 - 1);
          tVar13 = ptVar12->a_type;
          uVar14 = *(undefined4 *)&ptVar12->field_0x4;
          tVar15 = (ptVar12->a_w).w_float;
          uVar16 = *(undefined4 *)((long)&ptVar12->a_w + 4);
          goto LAB_00169b4e;
        }
        if ((ulong)uVar9 == 0) {
          ptVar8->a_type = A_FLOAT;
          *(undefined8 *)(pwVar6 + -1) = 0x169cbf;
          iVar3 = canvas_getdollarzero();
          (ptVar8->a_w).w_float = (float)iVar3;
        }
        else if (x_00 == &pd_objectmaker) {
          ptVar8->a_type = A_FLOAT;
          (ptVar8->a_w).w_float = 0.0;
        }
        else {
          *(undefined8 *)(pwVar6 + -1) = 0x169c2f;
          pd_error(x_00,"$%d: argument number out of range");
          ptVar8->a_type = A_FLOAT;
          (ptVar8->a_w).w_float = 0.0;
        }
        break;
      case A_DOLLSYM:
        ptVar5 = (a->a_w).w_symbol;
        *(undefined8 *)(pwVar6 + -1) = 0x169b8e;
        ptVar5 = binbuf_realizedollsym(ptVar5,argc,argv,(uint)(x_00 == &pd_objectmaker));
        if (ptVar5 == (t_symbol *)0x0) {
          pcVar7 = ((a->a_w).w_symbol)->s_name;
          *(undefined8 *)(pwVar6 + -1) = 0x169c99;
          pd_error(x_00,"%s: argument number out of range",pcVar7);
          ptVar8->a_type = A_SYMBOL;
          ptVar8->a_w = a->a_w;
        }
        else {
          ptVar8->a_type = A_SYMBOL;
          (ptVar8->a_w).w_symbol = ptVar5;
        }
      }
      ptVar8 = ptVar8 + 1;
      uVar11 = (ulong)((int)uVar11 - 1);
      a = a + 1;
      iVar10 = iVar10 + 1;
      iVar3 = 0;
      bVar2 = true;
    }
LAB_00169cf5:
  } while (iVar3 == 0);
  if (iVar3 != 0x10) goto LAB_00169dc5;
  if (iVar10 != 0) {
    tVar13 = local_48->a_type;
    if (tVar13 == A_FLOAT) {
      if (iVar10 == 1) {
        tVar15 = (local_48->a_w).w_float;
        *(undefined8 *)(pwVar6 + -1) = 0x169d7a;
        pd_float(x_00,tVar15);
      }
      else {
LAB_00169d90:
        *(undefined8 *)(pwVar6 + -1) = 0x169d9e;
        pd_list(x_00,(t_symbol *)0x0,iVar10,local_48);
      }
    }
    else if (tVar13 == A_POINTER) {
      if (iVar10 != 1) goto LAB_00169d90;
      gp = (local_48->a_w).w_gpointer;
      *(undefined8 *)(pwVar6 + -1) = 0x169d60;
      pd_pointer(x_00,gp);
    }
    else if (tVar13 == A_SYMBOL) {
      ptVar5 = (local_48->a_w).w_symbol;
      *(undefined8 *)(pwVar6 + -1) = 0x169d3f;
      pd_typedmess(x_00,ptVar5,iVar10 + -1,local_48 + 1);
    }
    else {
      *(undefined8 *)(pwVar6 + -1) = 0x169d8a;
      bug("bad selector");
    }
  }
  if ((int)uVar11 == 0) {
    uVar11 = 0;
    bVar2 = false;
    ptVar8 = local_48;
  }
  else {
    a = a + 1;
    uVar11 = (ulong)((int)uVar11 - 1);
    bVar2 = true;
    x_00 = local_70;
    ptVar8 = local_48;
  }
LAB_00169dc5:
  if (!bVar2) {
    if (999 < (int)local_3c) {
      *(undefined8 *)(pwVar6 + -1) = 0x169de7;
      freebytes(local_48,(ulong)local_3c << 4);
    }
    return;
  }
  goto LAB_001699b6;
}

Assistant:

void binbuf_eval(const t_binbuf *x, t_pd *target, int argc, const t_atom *argv)
{
    t_atom smallstack[SMALLMSG], *mstack, *msp;
    const t_atom *at = x->b_vec;
    int ac = x->b_n;
    int nargs, maxnargs = 0;
    t_pd *initial_target = target;

    if (ac <= SMALLMSG)
        mstack = smallstack;
    else
    {
#if 1
            /* count number of args in biggest message.  The weird
            treatment of "pd_objectmaker" is because when the message
            goes out to objectmaker, commas and semis are passed
            on as regular args (see below).  We're tacitly assuming here
            that the pd_objectmaker target can't come up via a named
            destination in the message, only because the original "target"
            points there. */
        if (target == &pd_objectmaker)
            maxnargs = ac;
        else
        {
            int i, j = (target ? 0 : -1);
            for (i = 0; i < ac; i++)
            {
                if (at[i].a_type == A_SEMI)
                    j = -1;
                else if (at[i].a_type == A_COMMA)
                    j = 0;
                else if (++j > maxnargs)
                    maxnargs = j;
            }
        }
        if (maxnargs <= SMALLMSG)
            mstack = smallstack;
        else ATOMS_ALLOCA(mstack, maxnargs);
#else
            /* just pessimistically allocate enough to hold everything
            at once.  This turned out to run slower in a simple benchmark
            I tried, perhaps because the extra memory allocation
            hurt the cache hit rate. */
        maxnargs = ac;
        ATOMS_ALLOCA(mstack, maxnargs);
#endif

    }
    msp = mstack;
    while (1)
    {
        t_pd *nexttarget;
            /* get a target. */
        while (!target)
        {
            t_symbol *s;
            while (ac && (at->a_type == A_SEMI || at->a_type == A_COMMA))
                ac--,  at++;
            if (!ac) break;
            if (at->a_type == A_DOLLAR)
            {
                if (at->a_w.w_index <= 0 || at->a_w.w_index > argc)
                {
                    pd_error(initial_target, "$%d: not enough arguments supplied",
                            at->a_w.w_index);
                    goto cleanup;
                }
                else if (argv[at->a_w.w_index-1].a_type != A_SYMBOL)
                {
                    pd_error(initial_target, "$%d: symbol needed as message destination",
                        at->a_w.w_index);
                    goto cleanup;
                }
                else s = argv[at->a_w.w_index-1].a_w.w_symbol;
            }
            else if (at->a_type == A_DOLLSYM)
            {
                if (!(s = binbuf_realizedollsym(at->a_w.w_symbol,
                    argc, argv, 0)))
                {
                    pd_error(initial_target, "$%s: not enough arguments supplied",
                        at->a_w.w_symbol->s_name);
                    goto cleanup;
                }
            }
            else s = atom_getsymbol(at);
            if (!(target = s->s_thing))
            {
                pd_error(initial_target, "%s: no such object ", s->s_name);
            cleanup:
                do at++, ac--;
                while (ac && at->a_type != A_SEMI);
                    /* LATER eat args until semicolon and continue */
                continue;
            }
            else
            {
                at++, ac--;
                break;
            }
        }
        if (!ac) break;
        nargs = 0;
        nexttarget = target;
        while (1)
        {
            t_symbol *s9;
            if (!ac) goto gotmess;
            switch (at->a_type)
            {
            case A_SEMI:
                    /* semis and commas in new message just get bashed to
                    a symbol.  This is needed so you can pass them to "expr." */
                if (target == &pd_objectmaker)
                {
                    SETSYMBOL(msp, gensym(";"));
                    break;
                }
                else
                {
                    nexttarget = 0;
                    goto gotmess;
                }
            case A_COMMA:
                if (target == &pd_objectmaker)
                {
                    SETSYMBOL(msp, gensym(","));
                    break;
                }
                else goto gotmess;
            case A_FLOAT:
            case A_SYMBOL:
                *msp = *at;
                break;
            case A_DOLLAR:
                if (at->a_w.w_index > 0 && at->a_w.w_index <= argc)
                    *msp = argv[at->a_w.w_index-1];
                else if (at->a_w.w_index == 0)
                    SETFLOAT(msp, canvas_getdollarzero());
                else
                {
                    if (target == &pd_objectmaker)
                        SETFLOAT(msp, 0);
                    else
                    {
                        pd_error(target, "$%d: argument number out of range",
                            at->a_w.w_index);
                        SETFLOAT(msp, 0);
                    }
                }
                break;
            case A_DOLLSYM:
                s9 = binbuf_realizedollsym(at->a_w.w_symbol, argc, argv,
                    target == &pd_objectmaker);
                if (!s9)
                {
                    pd_error(target, "%s: argument number out of range", at->a_w.w_symbol->s_name);
                    SETSYMBOL(msp, at->a_w.w_symbol);
                }
                else SETSYMBOL(msp, s9);
                break;
            default:
                bug("bad item in binbuf");
                goto broken;
            }
            msp++;
            ac--;
            at++;
            nargs++;
        }
    gotmess:
        if (nargs)
        {
            switch (mstack->a_type)
            {
            case A_SYMBOL:
                typedmess(target, mstack->a_w.w_symbol, nargs-1, mstack+1);
                break;
            case A_FLOAT:
                if (nargs == 1) pd_float(target, mstack->a_w.w_float);
                else pd_list(target, 0, nargs, mstack);
                break;
            case A_POINTER:
                if (nargs == 1) pd_pointer(target, mstack->a_w.w_gpointer);
                else pd_list(target, 0, nargs, mstack);
                break;
            default:
                bug("bad selector");
                break;
            }
        }
        msp = mstack;
        if (!ac) break;
        target = nexttarget;
        at++;
        ac--;
    }
broken:
    if (maxnargs > SMALLMSG)
         ATOMS_FREEA(mstack, maxnargs);
}